

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

void cpool_discard_conn(cpool *cpool,Curl_easy *data,connectdata *conn,_Bool aborted)

{
  long lVar1;
  CURLMcode CVar2;
  size_t sVar3;
  _Bool local_22;
  byte local_21;
  _Bool done;
  connectdata *pcStack_20;
  _Bool aborted_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  cpool *cpool_local;
  
  local_22 = false;
  local_21 = aborted;
  pcStack_20 = conn;
  conn_local = (connectdata *)data;
  data_local = (Curl_easy *)cpool;
  sVar3 = Curl_llist_count(&conn->easyq);
  if ((sVar3 == 0) || ((local_21 & 1) != 0)) {
    if (pcStack_20->connect_only != '\0') {
      local_21 = 1;
    }
    pcStack_20->bits =
         (ConnectBits)((ulong)pcStack_20->bits & 0xffffffffbfffffff | (ulong)(local_21 & 1) << 0x1e)
    ;
    if ((local_21 & 1) != 0) {
      local_22 = true;
    }
    if ((local_22 & 1U) == 0) {
      Curl_attach_connection((Curl_easy *)conn_local,pcStack_20);
      cpool_run_conn_shutdown((Curl_easy *)conn_local,pcStack_20,&local_22);
      Curl_detach_connection((Curl_easy *)conn_local);
    }
    if ((local_22 & 1U) == 0) {
      if ((((conn_local->socks_proxy).user != (char *)0x0) &&
          (0 < *(long *)((conn_local->socks_proxy).user + 0x238))) &&
         (lVar1 = *(long *)((conn_local->socks_proxy).user + 0x238),
         sVar3 = Curl_llist_count((Curl_llist *)&(data_local->conn_queue)._next),
         (long)sVar3 <= lVar1)) {
        cpool_shutdown_destroy_oldest((cpool *)data_local);
      }
      if (((conn_local->socks_proxy).user != (char *)0x0) &&
         (*(long *)((conn_local->socks_proxy).user + 0x98) != 0)) {
        memset(&pcStack_20->shutdown_poll,0,0x20);
        CVar2 = cpool_update_shutdown_ev
                          ((Curl_multi *)(conn_local->socks_proxy).user,
                           (Curl_easy *)(data_local->msg).list._prev,pcStack_20);
        if (CVar2 != CURLM_OK) {
          cpool_close_and_destroy((cpool *)data_local,pcStack_20,(Curl_easy *)conn_local,false);
          return;
        }
      }
      Curl_llist_append((Curl_llist *)&(data_local->conn_queue)._next,pcStack_20,
                        &pcStack_20->cpool_node);
    }
    else {
      cpool_close_and_destroy((cpool *)data_local,pcStack_20,(Curl_easy *)conn_local,false);
    }
  }
  return;
}

Assistant:

static void cpool_discard_conn(struct cpool *cpool,
                               struct Curl_easy *data,
                               struct connectdata *conn,
                               bool aborted)
{
  bool done = FALSE;

  DEBUGASSERT(data);
  DEBUGASSERT(cpool);
  DEBUGASSERT(!conn->bits.in_cpool);

  /*
   * If this connection is not marked to force-close, leave it open if there
   * are other users of it
   */
  if(CONN_INUSE(conn) && !aborted) {
    DEBUGF(infof(data, "[CCACHE] not discarding #%" FMT_OFF_T
                 " still in use by %zu transfers", conn->connection_id,
                 CONN_INUSE(conn)));
    return;
  }

  /* treat the connection as aborted in CONNECT_ONLY situations, we do
   * not know what the APP did with it. */
  if(conn->connect_only)
    aborted = TRUE;
  conn->bits.aborted = aborted;

  /* We do not shutdown dead connections. The term 'dead' can be misleading
   * here, as we also mark errored connections/transfers as 'dead'.
   * If we do a shutdown for an aborted transfer, the server might think
   * it was successful otherwise (for example an ftps: upload). This is
   * not what we want. */
  if(aborted)
    done = TRUE;
  if(!done) {
    /* Attempt to shutdown the connection right away. */
    Curl_attach_connection(data, conn);
    cpool_run_conn_shutdown(data, conn, &done);
    DEBUGF(infof(data, "[CCACHE] shutdown #%" FMT_OFF_T ", done=%d",
                 conn->connection_id, done));
    Curl_detach_connection(data);
  }

  if(done) {
    cpool_close_and_destroy(cpool, conn, data, FALSE);
    return;
  }

  /* Add the connection to our shutdown list for non-blocking shutdown
   * during multi processing. */
  if(data->multi && data->multi->max_shutdown_connections > 0 &&
     (data->multi->max_shutdown_connections >=
      (long)Curl_llist_count(&cpool->shutdowns))) {
    DEBUGF(infof(data, "[CCACHE] discarding oldest shutdown connection "
                       "due to limit of %ld",
                       data->multi->max_shutdown_connections));
    cpool_shutdown_destroy_oldest(cpool);
  }

  if(data->multi && data->multi->socket_cb) {
    DEBUGASSERT(cpool == &data->multi->cpool);
    /* Start with an empty shutdown pollset, so out internal closure handle
     * is added to the sockets. */
    memset(&conn->shutdown_poll, 0, sizeof(conn->shutdown_poll));
    if(cpool_update_shutdown_ev(data->multi, cpool->idata, conn)) {
      DEBUGF(infof(data, "[CCACHE] update events for shutdown failed, "
                   "discarding #%" FMT_OFF_T,
                   conn->connection_id));
      cpool_close_and_destroy(cpool, conn, data, FALSE);
      return;
    }
  }

  Curl_llist_append(&cpool->shutdowns, conn, &conn->cpool_node);
  DEBUGF(infof(data, "[CCACHE] added #%" FMT_OFF_T
               " to shutdown list of length %zu", conn->connection_id,
               Curl_llist_count(&cpool->shutdowns)));
}